

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

string * __thiscall
soul::Program::ProgramImpl::getStructNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,pool_ptr<const_soul::Module> *context,
          Structure *s)

{
  bool bVar1;
  Module *pMVar2;
  string *psVar3;
  bool local_c1;
  string local_98;
  byte local_71;
  pool_ptr<const_soul::Module> local_70;
  byte local_61;
  pool_ref<soul::Module> local_60;
  ArrayView<soul::RefCountedPtr<soul::Structure>_> local_58;
  reference local_48;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  Structure *s_local;
  pool_ptr<const_soul::Module> *context_local;
  ProgramImpl *this_local;
  
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(&this->modules);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                (&this->modules);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&m);
    if (!bVar1) {
      throwInternalCompilerError("getStructNameWithQualificationIfNeeded",0xe5);
    }
    local_48 = __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
               ::operator*(&__end2);
    pMVar2 = pool_ref<soul::Module>::operator->(local_48);
    local_58 = Module::Structs::get(&pMVar2->structs);
    bVar1 = contains<soul::ArrayView<soul::RefCountedPtr<soul::Structure>>,soul::Structure_const&>
                      (&local_58,s);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = pool_ptr<const_soul::Module>::operator!=(context,(void *)0x0);
  local_61 = 0;
  local_71 = 0;
  local_c1 = false;
  if (bVar1) {
    local_60.object = local_48->object;
    local_61 = 1;
    local_70 = (pool_ptr<const_soul::Module>)context->object;
    local_71 = 1;
    local_c1 = soul::operator==(&local_60,&local_70);
  }
  if ((local_71 & 1) != 0) {
    pool_ptr<const_soul::Module>::~pool_ptr(&local_70);
  }
  if ((local_61 & 1) != 0) {
    pool_ref<soul::Module>::~pool_ref(&local_60);
  }
  if (local_c1 == false) {
    pMVar2 = pool_ref<soul::Module>::operator->(local_48);
    psVar3 = Structure::getName_abi_cxx11_(s);
    TokenisedPathString::join(&local_98,&pMVar2->fullName,psVar3);
    stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    psVar3 = Structure::getName_abi_cxx11_(s);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getStructNameWithQualificationIfNeeded (pool_ptr<const Module> context, const Structure& s) const
    {
        for (auto& m : modules)
        {
            if (contains (m->structs.get(), s))
            {
                if (context != nullptr && m == context)
                    return s.getName();

                return stripRootNamespaceFromQualifiedPath (TokenisedPathString::join (m->fullName, s.getName()));
            }
        }

        SOUL_ASSERT_FALSE;
        return s.getName();
    }